

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Nbput_field(int g_a,int *lo,int *hi,int foff,int fsize,void *buf,int *ld,
                    ga_nbhdl_t *nbhandle)

{
  Integer IVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  Integer *pIVar5;
  long lStack_f8;
  void *local_f0;
  Integer _ld [7];
  Integer _ahi [7];
  Integer _alo [7];
  
  local_f0 = buf;
  IVar1 = pnga_ndim((long)g_a);
  lVar4 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  pIVar5 = _alo + IVar1 + -1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar5 = (long)lo[lVar4] + 1;
    pIVar5 = pIVar5 + -1;
  }
  pIVar5 = _ahi + IVar1 + -1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar5 = (long)hi[lVar4] + 1;
    pIVar5 = pIVar5 + -1;
  }
  lVar4 = 0;
  lVar3 = IVar1 + -1;
  if (IVar1 + -1 < 1) {
    lVar3 = lVar4;
  }
  plVar2 = &lStack_f8 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar2 = (long)ld[lVar4] + 1;
    plVar2 = plVar2 + -1;
  }
  pnga_nbput_field((long)g_a,_alo,_ahi,(long)foff,(long)fsize,local_f0,_ld,nbhandle);
  return;
}

Assistant:

void NGA_Nbput_field(int g_a, int *lo, int *hi, int foff, int fsize,
		     void *buf, int *ld, ga_nbhdl_t *nbhandle) {
  Integer a = (Integer)g_a;
  Integer andim = wnga_ndim(a);
  Integer _alo[MAXDIM], _ahi[MAXDIM];
  Integer _ld[MAXDIM];
  COPYINDEX_C2F(lo,_alo, andim);
  COPYINDEX_C2F(hi,_ahi, andim);
  COPYINDEX_C2F(ld, _ld, andim-1);

  wnga_nbput_field(a, _alo, _ahi, foff, fsize, buf, _ld, (Integer*)nbhandle);
}